

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kron.cpp
# Opt level: O0

void test_qclab_dense_kron<std::complex<float>>(void)

{
  complex<float> m32;
  complex<float> m32_00;
  complex<float> m32_01;
  bool bVar1;
  char *message;
  complex<float> in_RCX;
  complex<float> cVar2;
  complex<float> m01;
  complex<float> m01_00;
  complex<float> m01_01;
  complex<float> m01_02;
  complex<float> m01_03;
  complex<float> m01_04;
  complex<float> m01_05;
  complex<float> m01_06;
  complex<float> in_RSI;
  complex<float> cVar3;
  complex<float> in_R8;
  complex<float> in_R9;
  complex<float> in_stack_fffffffffffffb38;
  undefined7 in_stack_fffffffffffffb40;
  undefined1 in_stack_fffffffffffffb47;
  complex<float> in_stack_fffffffffffffb48;
  string local_478;
  AssertHelper local_458;
  Message local_450;
  bool local_441;
  undefined1 local_440 [8];
  AssertionResult gtest_ar__3;
  complex<float> local_428;
  complex<float> local_420;
  complex<float> local_418;
  complex<float> local_410;
  complex<float> local_408;
  complex<float> local_400;
  complex<float> local_3f8;
  complex<float> local_3f0;
  complex<float> local_3e8;
  complex<float> local_3e0;
  complex<float> local_3d8;
  complex<float> local_3d0;
  complex<float> local_3c8;
  complex<float> local_3c0;
  complex<float> local_3b8;
  undefined1 local_3b0 [8];
  SquareMatrix<std::complex<float>_> BoA_check;
  SquareMatrix<std::complex<float>_> BoA;
  AssertHelper local_370;
  Message local_368;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__2;
  complex<float> local_340;
  complex<float> local_338;
  complex<float> local_330;
  complex<float> local_328;
  complex<float> local_320;
  complex<float> local_318;
  complex<float> local_310;
  complex<float> local_308;
  complex<float> local_300;
  complex<float> local_2f8;
  complex<float> local_2f0;
  complex<float> local_2e8;
  complex<float> local_2e0;
  complex<float> local_2d8;
  complex<float> local_2d0;
  undefined1 local_2c8 [8];
  SquareMatrix<std::complex<float>_> AoB_check;
  SquareMatrix<std::complex<float>_> AoB;
  complex<float> local_2a0;
  complex<float> local_298;
  complex<float> local_290;
  undefined1 local_288 [8];
  SquareMatrix<std::complex<float>_> B;
  complex<float> local_270;
  complex<float> local_268;
  complex<float> local_260;
  undefined1 local_258 [8];
  SquareMatrix<std::complex<float>_> A;
  AssertHelper local_228;
  Message local_220;
  undefined1 local_211 [9];
  AssertionResult gtest_ar__1;
  complex<float> local_1f8;
  complex<float> local_1f0;
  complex<float> local_1e8;
  complex<float> local_1e0;
  complex<float> local_1d8;
  complex<float> local_1d0;
  complex<float> local_1c8;
  complex<float> local_1c0;
  complex<float> local_1b8;
  complex<float> local_1b0;
  complex<float> local_1a8;
  complex<float> local_1a0;
  complex<float> local_198;
  complex<float> local_190;
  complex<float> local_188;
  undefined1 local_180 [8];
  SquareMatrix<std::complex<float>_> XoI_check;
  SquareMatrix<std::complex<float>_> XoI;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  complex<float> local_110;
  complex<float> local_108;
  complex<float> local_100;
  complex<float> local_f8;
  complex<float> local_f0;
  complex<float> local_e8;
  complex<float> local_e0;
  complex<float> local_d8;
  complex<float> local_d0;
  complex<float> local_c8;
  complex<float> local_c0;
  complex<float> local_b8;
  complex<float> local_b0;
  complex<float> local_a8;
  complex<float> local_a0;
  undefined1 local_98 [8];
  SquareMatrix<std::complex<float>_> IoX_check;
  SquareMatrix<std::complex<float>_> IoX;
  complex<float> local_6c;
  complex<float> local_64 [2];
  complex<float> local_50;
  undefined1 local_48 [8];
  SquareMatrix<std::complex<float>_> X;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20;
  undefined1 local_18 [8];
  SquareMatrix<std::complex<float>_> I;
  
  std::complex<float>::complex(&local_20,1.0,0.0);
  std::complex<float>::complex(&local_28,0.0,0.0);
  std::complex<float>::complex(&local_30,0.0,0.0);
  std::complex<float>::complex((complex<float> *)&X.data_,1.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_18,in_RSI,m01,in_RCX,in_R8);
  std::complex<float>::complex(&local_50,0.0,0.0);
  std::complex<float>::complex(local_64,1.0,0.0);
  std::complex<float>::complex(&local_6c,1.0,0.0);
  std::complex<float>::complex
            ((complex<float> *)
             ((long)&IoX.data_._M_t.
                     super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                     .super__Head_base<0UL,_std::complex<float>_*,_false> + 4),0.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_48,in_RSI,m01_00,in_RCX,in_R8);
  cVar3._M_value = (_ComplexT)local_18;
  qclab::dense::kron<std::complex<float>>
            ((dense *)&IoX_check.data_,(SquareMatrix<std::complex<float>_> *)cVar3._M_value,
             (SquareMatrix<std::complex<float>_> *)local_48);
  std::complex<float>::complex(&local_a0,0.0,0.0);
  std::complex<float>::complex(&local_a8,1.0,0.0);
  std::complex<float>::complex(&local_b0,0.0,0.0);
  std::complex<float>::complex(&local_b8,0.0,0.0);
  std::complex<float>::complex(&local_c0,1.0,0.0);
  std::complex<float>::complex(&local_c8,0.0,0.0);
  std::complex<float>::complex(&local_d0,0.0,0.0);
  std::complex<float>::complex(&local_d8,0.0,0.0);
  std::complex<float>::complex(&local_e0,0.0,0.0);
  std::complex<float>::complex(&local_e8,0.0,0.0);
  std::complex<float>::complex(&local_f0,0.0,0.0);
  std::complex<float>::complex(&local_f8,1.0,0.0);
  std::complex<float>::complex(&local_100,0.0,0.0);
  std::complex<float>::complex(&local_108,0.0,0.0);
  std::complex<float>::complex(&local_110,1.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar_.message_,0.0,0.0);
  cVar2._M_value._7_1_ = in_stack_fffffffffffffb47;
  cVar2._M_value._0_7_ = in_stack_fffffffffffffb40;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_98,cVar3,m01_01,local_e0,in_R8,in_R9,
             local_e0,local_e8,local_f0,local_f8,local_100,local_108,local_110,
             (complex<float>)
             gtest_ar_.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_fffffffffffffb38,cVar2,in_stack_fffffffffffffb48);
  local_129 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&IoX_check.data_,
                         (SquareMatrix<std::complex<float>_> *)local_98);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&XoI.data_,(internal *)local_128,(AssertionResult *)"IoX == IoX_check",
               "false","true",(char *)in_R9._M_value);
    in_R8._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x14,(char *)in_R8._M_value);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&XoI.data_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  cVar3._M_value = (_ComplexT)local_48;
  qclab::dense::kron<std::complex<float>>
            ((dense *)&XoI_check.data_,(SquareMatrix<std::complex<float>_> *)cVar3._M_value,
             (SquareMatrix<std::complex<float>_> *)local_18);
  std::complex<float>::complex(&local_188,0.0,0.0);
  std::complex<float>::complex(&local_190,0.0,0.0);
  std::complex<float>::complex(&local_198,1.0,0.0);
  std::complex<float>::complex(&local_1a0,0.0,0.0);
  std::complex<float>::complex(&local_1a8,0.0,0.0);
  std::complex<float>::complex(&local_1b0,0.0,0.0);
  std::complex<float>::complex(&local_1b8,0.0,0.0);
  std::complex<float>::complex(&local_1c0,1.0,0.0);
  std::complex<float>::complex(&local_1c8,1.0,0.0);
  std::complex<float>::complex(&local_1d0,0.0,0.0);
  std::complex<float>::complex(&local_1d8,0.0,0.0);
  std::complex<float>::complex(&local_1e0,0.0,0.0);
  std::complex<float>::complex(&local_1e8,0.0,0.0);
  std::complex<float>::complex(&local_1f0,1.0,0.0);
  std::complex<float>::complex(&local_1f8,0.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__1.message_,0.0,0.0);
  m32._M_value._7_1_ = in_stack_fffffffffffffb47;
  m32._M_value._0_7_ = in_stack_fffffffffffffb40;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_180,cVar3,m01_02,local_1c8,in_R8,in_R9,
             local_1c8,local_1d0,local_1d8,local_1e0,local_1e8,local_1f0,local_1f8,
             (complex<float>)
             gtest_ar__1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_fffffffffffffb38,m32,in_stack_fffffffffffffb48);
  local_211[0] = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                           ((SquareMatrix<std::complex<float>_> *)&XoI_check.data_,
                            (SquareMatrix<std::complex<float>_> *)local_180);
  cVar3._M_value = (_ComplexT)local_211;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)(local_211 + 1),(bool *)cVar3._M_value,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_211 + 1));
  cVar2._M_value = local_1c8._M_value;
  if (!bVar1) {
    testing::Message::Message(&local_220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&A.data_,(internal *)(local_211 + 1),(AssertionResult *)"XoI == XoI_check",
               "false","true",(char *)in_R9._M_value);
    in_R8._M_value = std::__cxx11::string::c_str();
    cVar2._M_value = 0x1c;
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x1c,(char *)in_R8._M_value);
    cVar3._M_value = (_ComplexT)&local_220;
    testing::internal::AssertHelper::operator=(&local_228,(Message *)cVar3._M_value);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    std::__cxx11::string::~string((string *)&A.data_);
    testing::Message::~Message(&local_220);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_211 + 1));
  std::complex<float>::complex(&local_260,1.0,0.0);
  std::complex<float>::complex(&local_268,2.0,0.0);
  std::complex<float>::complex(&local_270,3.0,0.0);
  std::complex<float>::complex((complex<float> *)&B.data_,5.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_258,cVar3,m01_03,cVar2,in_R8);
  std::complex<float>::complex(&local_290,7.0,0.0);
  std::complex<float>::complex(&local_298,11.0,0.0);
  std::complex<float>::complex(&local_2a0,13.0,0.0);
  std::complex<float>::complex((complex<float> *)&AoB.data_,17.0,0.0);
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_288,cVar3,m01_04,cVar2,in_R8);
  cVar3._M_value = (_ComplexT)local_258;
  qclab::dense::kron<std::complex<float>>
            ((dense *)&AoB_check.data_,(SquareMatrix<std::complex<float>_> *)cVar3._M_value,
             (SquareMatrix<std::complex<float>_> *)local_288);
  std::complex<float>::complex(&local_2d0,7.0,0.0);
  std::complex<float>::complex(&local_2d8,11.0,0.0);
  std::complex<float>::complex(&local_2e0,14.0,0.0);
  std::complex<float>::complex(&local_2e8,22.0,0.0);
  std::complex<float>::complex(&local_2f0,13.0,0.0);
  std::complex<float>::complex(&local_2f8,17.0,0.0);
  std::complex<float>::complex(&local_300,26.0,0.0);
  std::complex<float>::complex(&local_308,34.0,0.0);
  std::complex<float>::complex(&local_310,21.0,0.0);
  std::complex<float>::complex(&local_318,33.0,0.0);
  std::complex<float>::complex(&local_320,35.0,0.0);
  std::complex<float>::complex(&local_328,55.0,0.0);
  std::complex<float>::complex(&local_330,39.0,0.0);
  std::complex<float>::complex(&local_338,51.0,0.0);
  std::complex<float>::complex(&local_340,65.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__2.message_,85.0,0.0);
  m32_00._M_value._7_1_ = in_stack_fffffffffffffb47;
  m32_00._M_value._0_7_ = in_stack_fffffffffffffb40;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_2c8,cVar3,m01_05,local_310,in_R8,in_R9,
             local_310,local_318,local_320,local_328,local_330,local_338,local_340,
             (complex<float>)
             gtest_ar__2.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_fffffffffffffb38,m32_00,in_stack_fffffffffffffb48);
  local_359 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&AoB_check.data_,
                         (SquareMatrix<std::complex<float>_> *)local_2c8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&BoA.data_,(internal *)local_358,(AssertionResult *)"AoB == AoB_check",
               "false","true",(char *)in_R9._M_value);
    in_R8._M_value = std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x2b,(char *)in_R8._M_value);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&BoA.data_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  cVar3._M_value = (_ComplexT)local_288;
  qclab::dense::kron<std::complex<float>>
            ((dense *)&BoA_check.data_,(SquareMatrix<std::complex<float>_> *)cVar3._M_value,
             (SquareMatrix<std::complex<float>_> *)local_258);
  std::complex<float>::complex(&local_3b8,7.0,0.0);
  std::complex<float>::complex(&local_3c0,14.0,0.0);
  std::complex<float>::complex(&local_3c8,11.0,0.0);
  std::complex<float>::complex(&local_3d0,22.0,0.0);
  std::complex<float>::complex(&local_3d8,21.0,0.0);
  std::complex<float>::complex(&local_3e0,35.0,0.0);
  std::complex<float>::complex(&local_3e8,33.0,0.0);
  std::complex<float>::complex(&local_3f0,55.0,0.0);
  std::complex<float>::complex(&local_3f8,13.0,0.0);
  std::complex<float>::complex(&local_400,26.0,0.0);
  std::complex<float>::complex(&local_408,17.0,0.0);
  std::complex<float>::complex(&local_410,34.0,0.0);
  std::complex<float>::complex(&local_418,39.0,0.0);
  std::complex<float>::complex(&local_420,65.0,0.0);
  std::complex<float>::complex(&local_428,51.0,0.0);
  std::complex<float>::complex((complex<float> *)&gtest_ar__3.message_,85.0,0.0);
  m32_01._M_value._7_1_ = in_stack_fffffffffffffb47;
  m32_01._M_value._0_7_ = in_stack_fffffffffffffb40;
  qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3b0,cVar3,m01_06,local_3f8,in_R8,in_R9,
             local_3f8,local_400,local_408,local_410,local_418,local_420,local_428,
             (complex<float>)
             gtest_ar__3.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl,in_stack_fffffffffffffb38,m32_01,(complex<float>)&stack0xfffffffffffffaf8
            );
  local_441 = qclab::dense::SquareMatrix<std::complex<float>_>::operator==
                        ((SquareMatrix<std::complex<float>_> *)&BoA_check.data_,
                         (SquareMatrix<std::complex<float>_> *)local_3b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_440,&local_441,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)local_440,(AssertionResult *)"BoA == BoA_check","false","true"
               ,(char *)in_R9._M_value);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/test/dense/kron.cpp"
               ,0x33,message);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_3b0);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&BoA_check.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_2c8);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&AoB_check.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_288);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_258);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_180);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&XoI_check.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_98);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)&IoX_check.data_);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_48);
  qclab::dense::SquareMatrix<std::complex<float>_>::~SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)local_18);
  return;
}

Assistant:

void test_qclab_dense_kron() {

  qclab::dense::SquareMatrix< T >  I( 1 , 0 ,
                                      0 , 1 ) ;
  qclab::dense::SquareMatrix< T >  X( 0 , 1 ,
                                      1 , 0 ) ;
//std::cout << "I =\n" ; qclab::printMatrix2x2( I ) ;
//std::cout << "X =\n" ; qclab::printMatrix2x2( X ) ;

  qclab::dense::SquareMatrix< T >  IoX = qclab::dense::kron( I , X ) ;
  qclab::dense::SquareMatrix< T >  IoX_check( 0 , 1 , 0 , 0 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              0 , 0 , 1 , 0 ) ;
  EXPECT_TRUE( IoX == IoX_check ) ;
//std::cout << "I otimes X =\n" ; qclab::printMatrix4x4( IoX ) ;

  qclab::dense::SquareMatrix< T >  XoI = qclab::dense::kron( X , I ) ;
  qclab::dense::SquareMatrix< T >  XoI_check( 0 , 0 , 1 , 0 ,
                                              0 , 0 , 0 , 1 ,
                                              1 , 0 , 0 , 0 ,
                                              0 , 1 , 0 , 0 ) ;
  EXPECT_TRUE( XoI == XoI_check ) ;
//std::cout << "X otimes I =\n" ; qclab::printMatrix4x4( XoI ) ;

  qclab::dense::SquareMatrix< T >  A(  1 ,  2 ,
                                       3 ,  5 ) ;
  qclab::dense::SquareMatrix< T >  B(  7 , 11 ,
                                      13 , 17 ) ;
//std::cout << "A =\n" ; qclab::printMatrix2x2( A ) ;
//std::cout << "B =\n" ; qclab::printMatrix2x2( B ) ;

  qclab::dense::SquareMatrix< T >  AoB = qclab::dense::kron( A , B ) ;
  qclab::dense::SquareMatrix< T >  AoB_check(  7 , 11 , 14 , 22 ,
                                              13 , 17 , 26 , 34 ,
                                              21 , 33 , 35 , 55 ,
                                              39 , 51 , 65 , 85 ) ;
  EXPECT_TRUE( AoB == AoB_check ) ;
//std::cout << "A otimes B =\n" ; qclab::printMatrix4x4( AoB ) ;

  qclab::dense::SquareMatrix< T >  BoA = qclab::dense::kron( B , A ) ;
  qclab::dense::SquareMatrix< T >  BoA_check(  7 , 14 , 11 , 22 ,
                                              21 , 35 , 33 , 55 ,
                                              13 , 26 , 17 , 34 ,
                                              39 , 65 , 51 , 85 ) ;
  EXPECT_TRUE( BoA == BoA_check ) ;
//std::cout << "B otimes A =\n" ; qclab::printMatrix4x4( BoA ) ;

}